

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O0

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  uint uVar1;
  U32 UVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  BYTE *pBVar9;
  reg_t rVar10;
  BYTE *pBVar11;
  char *pcVar12;
  BYTE *pBVar13;
  bool bVar14;
  int local_8c0;
  int local_8bc;
  int result_1;
  int result;
  BYTE *sourceEnd;
  BYTE *smallest;
  BYTE *dictEnd;
  LZ4_stream_t_internal *streamPtr;
  int acceleration_local;
  int maxOutputSize_local;
  int inputSize_local;
  char *dest_local;
  char *source_local;
  LZ4_stream_t *LZ4_stream_local;
  char *local_868;
  size_t accumulator_3;
  size_t lastRun_3;
  BYTE *pBStack_850;
  uint more_3;
  BYTE *limit_3;
  uint matchCode_3;
  int len_3;
  uint litLength_3;
  U32 h_16;
  uint searchMatchNb_3;
  uint step_3;
  BYTE *forwardIp_3;
  BYTE *token_3;
  BYTE *match_3;
  ptrdiff_t refDelta_3;
  U32 forwardH_3;
  BYTE *olimit_3;
  BYTE *op_3;
  BYTE *matchlimit_3;
  BYTE *mflimit_3;
  BYTE *iend_3;
  BYTE *anchor_3;
  ptrdiff_t dictDelta_3;
  BYTE *dictEnd_4;
  BYTE *dictionary_3;
  BYTE *lowRefLimit_3;
  BYTE *lowLimit_3;
  BYTE *base_3;
  BYTE *ip_3;
  int local_764;
  char *local_760;
  size_t accumulator_2;
  size_t lastRun_2;
  BYTE *pBStack_748;
  uint more_2;
  BYTE *limit_2;
  uint matchCode_2;
  int len_2;
  uint litLength_2;
  U32 h_11;
  uint searchMatchNb_2;
  uint step_2;
  BYTE *forwardIp_2;
  BYTE *token_2;
  BYTE *match_2;
  ptrdiff_t refDelta_2;
  U32 forwardH_2;
  BYTE *olimit_2;
  BYTE *op_2;
  BYTE *matchlimit_2;
  BYTE *mflimit_2;
  BYTE *iend_2;
  BYTE *anchor_2;
  ptrdiff_t dictDelta_2;
  BYTE *dictEnd_3;
  BYTE *dictionary_2;
  BYTE *lowRefLimit_2;
  BYTE *lowLimit_2;
  BYTE *base_2;
  BYTE *ip_2;
  int local_65c;
  char *local_658;
  size_t accumulator_1;
  size_t lastRun_1;
  uint more_1;
  BYTE *limit_1;
  uint matchCode_1;
  int len_1;
  uint litLength_1;
  U32 h_6;
  uint searchMatchNb_1;
  uint step_1;
  BYTE *forwardIp_1;
  BYTE *token_1;
  BYTE *match_1;
  ptrdiff_t refDelta_1;
  U32 forwardH_1;
  BYTE *olimit_1;
  BYTE *op_1;
  BYTE *matchlimit_1;
  BYTE *mflimit_1;
  BYTE *iend_1;
  BYTE *anchor_1;
  ptrdiff_t dictDelta_1;
  BYTE *dictEnd_2;
  BYTE *dictionary_1;
  BYTE *lowRefLimit_1;
  BYTE *lowLimit_1;
  BYTE *base_1;
  BYTE *ip_1;
  int local_554;
  char *local_550;
  size_t accumulator;
  size_t lastRun;
  uint more;
  BYTE *limit;
  uint matchCode;
  int len;
  uint litLength;
  U32 h_1;
  uint searchMatchNb;
  uint step;
  BYTE *forwardIp;
  BYTE *token;
  BYTE *match;
  ptrdiff_t refDelta;
  U32 forwardH;
  BYTE *olimit;
  BYTE *op;
  BYTE *matchlimit;
  BYTE *mflimit;
  BYTE *iend;
  BYTE *anchor;
  ptrdiff_t dictDelta;
  BYTE *dictEnd_1;
  BYTE *dictionary;
  BYTE *lowRefLimit;
  BYTE *lowLimit;
  BYTE *base;
  BYTE *ip;
  int local_450;
  U32 h_4;
  U32 h_2;
  U32 h;
  U32 h_9;
  U32 h_7;
  U32 h_5;
  U32 h_14;
  U32 h_12;
  U32 h_10;
  U32 h_19;
  U32 h_17;
  U32 h_15;
  U32 h_3;
  U32 h_8;
  U32 h_13;
  U32 h_18;
  
  puVar7 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  if ((LZ4_stream->internal_donotuse).initCheck == 0) {
    sourceEnd = (BYTE *)source;
    if (((LZ4_stream->internal_donotuse).dictSize != 0) &&
       (sourceEnd = (BYTE *)source, puVar7 < source)) {
      sourceEnd = puVar7;
    }
    LZ4_renormDictT(&LZ4_stream->internal_donotuse,sourceEnd);
    streamPtr._4_4_ = acceleration;
    if (acceleration < 1) {
      streamPtr._4_4_ = 1;
    }
    puVar8 = (uint8_t *)(source + inputSize);
    if (((uint8_t *)LZ4_stream->table[0x801] < puVar8) && (puVar8 < puVar7)) {
      (LZ4_stream->internal_donotuse).dictSize = (int)puVar7 - (int)puVar8;
      if (0x10000 < (LZ4_stream->internal_donotuse).dictSize) {
        (LZ4_stream->internal_donotuse).dictSize = 0x10000;
      }
      if ((LZ4_stream->internal_donotuse).dictSize < 4) {
        (LZ4_stream->internal_donotuse).dictSize = 0;
      }
      (LZ4_stream->internal_donotuse).dictionary =
           puVar7 + -(ulong)(LZ4_stream->internal_donotuse).dictSize;
    }
    local_450 = (int)dest;
    if (puVar7 == (uint8_t *)source) {
      if (((LZ4_stream->internal_donotuse).dictSize < 0x10000) &&
         ((LZ4_stream->internal_donotuse).dictSize < (LZ4_stream->internal_donotuse).currentOffset))
      {
        uVar1 = (LZ4_stream->internal_donotuse).dictSize;
        if ((uint)inputSize < 0x7e000001) {
          pBVar9 = (BYTE *)(source + -(ulong)(LZ4_stream->internal_donotuse).currentOffset);
          uVar6 = (LZ4_stream->internal_donotuse).dictSize;
          olimit = (BYTE *)dest;
          iend = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0010deb2:
            pcVar12 = source + ((long)inputSize - (long)iend);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit + (long)(pcVar12 + (ulong)(pcVar12 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_450 = 0;
            }
            else {
              if (pcVar12 < (char *)0xf) {
                *olimit = (char)pcVar12 * '\x10';
                olimit = olimit + 1;
              }
              else {
                *olimit = 0xf0;
                pBVar9 = olimit;
                for (local_550 = pcVar12 + -0xf; olimit = pBVar9 + 1, (char *)0xfe < local_550;
                    local_550 = local_550 + -0xff) {
                  *olimit = 0xff;
                  pBVar9 = olimit;
                }
                *olimit = (BYTE)local_550;
                olimit = pBVar9 + 2;
              }
              memcpy(olimit,iend,(size_t)pcVar12);
              local_450 = ((int)pcVar12 + (int)olimit) - local_450;
            }
          }
          else {
            rVar10 = LZ4_read_ARCH(source);
            UVar2 = LZ4_hash5(rVar10,byU32);
            LZ4_putPositionOnHash((BYTE *)source,UVar2,LZ4_stream,byU32,pBVar9);
            base = (BYTE *)(source + 1);
            rVar10 = LZ4_read_ARCH(base);
            refDelta._4_4_ = LZ4_hash5(rVar10,byU32);
            while( true ) {
              _searchMatchNb = base;
              h_1 = 1;
              litLength = streamPtr._4_4_ << 6;
              do {
                base = _searchMatchNb;
                pBVar11 = _searchMatchNb + h_1;
                h_1 = litLength >> 6;
                if (source + (long)inputSize + -0xc < pBVar11) goto LAB_0010deb2;
                token = LZ4_getPositionOnHash(refDelta._4_4_,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(pBVar11);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(_searchMatchNb,refDelta._4_4_,LZ4_stream,byU32,pBVar9);
                bVar14 = true;
                if ((source + -(ulong)uVar1 <= token) &&
                   (bVar14 = true, _searchMatchNb <= token + 0xffff)) {
                  UVar3 = LZ4_read32(token);
                  UVar4 = LZ4_read32(_searchMatchNb);
                  bVar14 = UVar3 != UVar4;
                }
                litLength = litLength + 1;
                _searchMatchNb = pBVar11;
                refDelta._4_4_ = UVar2;
              } while (bVar14);
              while( true ) {
                bVar14 = false;
                if (iend < base && source + -(ulong)uVar6 < token) {
                  bVar14 = base[-1] == token[-1];
                }
                if (!bVar14) break;
                base = base + -1;
                token = token + -1;
              }
              uVar5 = (int)base - (int)iend;
              pBVar11 = olimit + 1;
              forwardIp = olimit;
              if (dest + maxOutputSize < pBVar11 + (ulong)uVar5 / 0xff + (ulong)uVar5 + 8) break;
              if (uVar5 < 0xf) {
                *olimit = (char)uVar5 * '\x10';
                olimit = pBVar11;
              }
              else {
                *olimit = 0xf0;
                olimit = pBVar11;
                for (limit._4_4_ = uVar5 - 0xf; 0xfe < limit._4_4_;
                    limit._4_4_ = limit._4_4_ + -0xff) {
                  *olimit = 0xff;
                  olimit = olimit + 1;
                }
                *olimit = (BYTE)limit._4_4_;
                olimit = olimit + 1;
              }
              LZ4_wildCopy(olimit,iend,olimit + uVar5);
              olimit = olimit + uVar5;
              while( true ) {
                LZ4_writeLE16(olimit,(short)base - (short)token);
                pBVar11 = olimit + 2;
                uVar5 = LZ4_count(base + 4,token + 4,(BYTE *)(source + (long)inputSize + -5));
                iend = base + (uVar5 + 4);
                if (dest + maxOutputSize < olimit + (ulong)(uVar5 >> 8) + 8) {
                  local_450 = 0;
                  goto LAB_0010e037;
                }
                olimit = pBVar11;
                if (uVar5 < 0xf) {
                  *forwardIp = *forwardIp + (char)uVar5;
                }
                else {
                  *forwardIp = *forwardIp + '\x0f';
                  LZ4_write32(pBVar11,0xffffffff);
                  for (limit._0_4_ = uVar5 - 0xf; 0x3fb < (uint)limit;
                      limit._0_4_ = (uint)limit - 0x3fc) {
                    olimit = olimit + 4;
                    LZ4_write32(olimit,0xffffffff);
                  }
                  olimit[(ulong)(uint)limit / 0xff] = (BYTE)((ulong)(uint)limit % 0xff);
                  olimit = olimit + (ulong)(uint)limit / 0xff + 1;
                }
                if (source + (long)inputSize + -0xc < iend) goto LAB_0010deb2;
                rVar10 = LZ4_read_ARCH(iend + -2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(iend + -2,UVar2,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(iend);
                UVar2 = LZ4_hash5(rVar10,byU32);
                token = LZ4_getPositionOnHash(UVar2,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(iend);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(iend,UVar2,LZ4_stream,byU32,pBVar9);
                if ((token < source + -(ulong)uVar1) || (token + 0xffff < iend)) break;
                UVar2 = LZ4_read32(token);
                UVar3 = LZ4_read32(iend);
                if (UVar2 != UVar3) break;
                forwardIp = olimit;
                *olimit = '\0';
                olimit = olimit + 1;
                base = iend;
              }
              base = iend + 1;
              rVar10 = LZ4_read_ARCH(base);
              refDelta._4_4_ = LZ4_hash5(rVar10,byU32);
            }
            local_450 = 0;
          }
        }
        else {
          local_450 = 0;
        }
LAB_0010e037:
        local_8bc = local_450;
      }
      else {
        if ((uint)inputSize < 0x7e000001) {
          pBVar9 = (BYTE *)(source + -(ulong)(LZ4_stream->internal_donotuse).currentOffset);
          uVar1 = (LZ4_stream->internal_donotuse).dictSize;
          olimit_1 = (BYTE *)dest;
          iend_1 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0010eedd:
            pcVar12 = source + ((long)inputSize - (long)iend_1);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_1 + (long)(pcVar12 + (ulong)(pcVar12 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_554 = 0;
            }
            else {
              if (pcVar12 < (char *)0xf) {
                *olimit_1 = (char)pcVar12 * '\x10';
                olimit_1 = olimit_1 + 1;
              }
              else {
                *olimit_1 = 0xf0;
                pBVar9 = olimit_1;
                for (local_658 = pcVar12 + -0xf; olimit_1 = pBVar9 + 1, (char *)0xfe < local_658;
                    local_658 = local_658 + -0xff) {
                  *olimit_1 = 0xff;
                  pBVar9 = olimit_1;
                }
                *olimit_1 = (BYTE)local_658;
                olimit_1 = pBVar9 + 2;
              }
              memcpy(olimit_1,iend_1,(size_t)pcVar12);
              local_554 = ((int)pcVar12 + (int)olimit_1) - local_450;
            }
          }
          else {
            rVar10 = LZ4_read_ARCH(source);
            UVar2 = LZ4_hash5(rVar10,byU32);
            LZ4_putPositionOnHash((BYTE *)source,UVar2,LZ4_stream,byU32,pBVar9);
            base_1 = (BYTE *)(source + 1);
            rVar10 = LZ4_read_ARCH(base_1);
            refDelta_1._4_4_ = LZ4_hash5(rVar10,byU32);
            while( true ) {
              _searchMatchNb_1 = base_1;
              h_6 = 1;
              litLength_1 = streamPtr._4_4_ << 6;
              do {
                base_1 = _searchMatchNb_1;
                pBVar11 = _searchMatchNb_1 + h_6;
                h_6 = litLength_1 >> 6;
                if (source + (long)inputSize + -0xc < pBVar11) goto LAB_0010eedd;
                token_1 = LZ4_getPositionOnHash(refDelta_1._4_4_,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(pBVar11);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_1,refDelta_1._4_4_,LZ4_stream,byU32,pBVar9);
                bVar14 = true;
                if (_searchMatchNb_1 <= token_1 + 0xffff) {
                  UVar3 = LZ4_read32(token_1);
                  UVar4 = LZ4_read32(_searchMatchNb_1);
                  bVar14 = UVar3 != UVar4;
                }
                litLength_1 = litLength_1 + 1;
                _searchMatchNb_1 = pBVar11;
                refDelta_1._4_4_ = UVar2;
              } while (bVar14);
              while( true ) {
                bVar14 = false;
                if (iend_1 < base_1 && source + -(ulong)uVar1 < token_1) {
                  bVar14 = base_1[-1] == token_1[-1];
                }
                if (!bVar14) break;
                base_1 = base_1 + -1;
                token_1 = token_1 + -1;
              }
              uVar6 = (int)base_1 - (int)iend_1;
              pBVar11 = olimit_1 + 1;
              forwardIp_1 = olimit_1;
              if (dest + maxOutputSize < pBVar11 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8) break;
              if (uVar6 < 0xf) {
                *olimit_1 = (char)uVar6 * '\x10';
                olimit_1 = pBVar11;
              }
              else {
                *olimit_1 = 0xf0;
                olimit_1 = pBVar11;
                for (limit_1._4_4_ = uVar6 - 0xf; 0xfe < limit_1._4_4_;
                    limit_1._4_4_ = limit_1._4_4_ + -0xff) {
                  *olimit_1 = 0xff;
                  olimit_1 = olimit_1 + 1;
                }
                *olimit_1 = (BYTE)limit_1._4_4_;
                olimit_1 = olimit_1 + 1;
              }
              LZ4_wildCopy(olimit_1,iend_1,olimit_1 + uVar6);
              olimit_1 = olimit_1 + uVar6;
              while( true ) {
                LZ4_writeLE16(olimit_1,(short)base_1 - (short)token_1);
                pBVar11 = olimit_1 + 2;
                uVar6 = LZ4_count(base_1 + 4,token_1 + 4,(BYTE *)(source + (long)inputSize + -5));
                iend_1 = base_1 + (uVar6 + 4);
                if (dest + maxOutputSize < olimit_1 + (ulong)(uVar6 >> 8) + 8) {
                  local_554 = 0;
                  goto LAB_0010f062;
                }
                olimit_1 = pBVar11;
                if (uVar6 < 0xf) {
                  *forwardIp_1 = *forwardIp_1 + (char)uVar6;
                }
                else {
                  *forwardIp_1 = *forwardIp_1 + '\x0f';
                  LZ4_write32(pBVar11,0xffffffff);
                  for (limit_1._0_4_ = uVar6 - 0xf; 0x3fb < (uint)limit_1;
                      limit_1._0_4_ = (uint)limit_1 - 0x3fc) {
                    olimit_1 = olimit_1 + 4;
                    LZ4_write32(olimit_1,0xffffffff);
                  }
                  olimit_1[(ulong)(uint)limit_1 / 0xff] = (BYTE)((ulong)(uint)limit_1 % 0xff);
                  olimit_1 = olimit_1 + (ulong)(uint)limit_1 / 0xff + 1;
                }
                if (source + (long)inputSize + -0xc < iend_1) goto LAB_0010eedd;
                rVar10 = LZ4_read_ARCH(iend_1 + -2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(iend_1 + -2,UVar2,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(iend_1);
                UVar2 = LZ4_hash5(rVar10,byU32);
                token_1 = LZ4_getPositionOnHash(UVar2,LZ4_stream,byU32,pBVar9);
                rVar10 = LZ4_read_ARCH(iend_1);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(iend_1,UVar2,LZ4_stream,byU32,pBVar9);
                if (token_1 + 0xffff < iend_1) break;
                UVar2 = LZ4_read32(token_1);
                UVar3 = LZ4_read32(iend_1);
                if (UVar2 != UVar3) break;
                forwardIp_1 = olimit_1;
                *olimit_1 = '\0';
                olimit_1 = olimit_1 + 1;
                base_1 = iend_1;
              }
              base_1 = iend_1 + 1;
              rVar10 = LZ4_read_ARCH(base_1);
              refDelta_1._4_4_ = LZ4_hash5(rVar10,byU32);
            }
            local_554 = 0;
          }
        }
        else {
          local_554 = 0;
        }
LAB_0010f062:
        local_8bc = local_554;
      }
      (LZ4_stream->internal_donotuse).dictSize =
           inputSize + (LZ4_stream->internal_donotuse).dictSize;
      (LZ4_stream->internal_donotuse).currentOffset =
           inputSize + (LZ4_stream->internal_donotuse).currentOffset;
      LZ4_stream_local._4_4_ = local_8bc;
    }
    else {
      if (((LZ4_stream->internal_donotuse).dictSize < 0x10000) &&
         ((LZ4_stream->internal_donotuse).dictSize < (LZ4_stream->internal_donotuse).currentOffset))
      {
        uVar1 = (LZ4_stream->internal_donotuse).dictSize;
        puVar7 = (LZ4_stream->internal_donotuse).dictionary;
        uVar6 = (LZ4_stream->internal_donotuse).dictSize;
        pBVar9 = (BYTE *)(source + (long)inputSize + -5);
        if ((uint)inputSize < 0x7e000001) {
          pBVar11 = (BYTE *)(source + -(ulong)(LZ4_stream->internal_donotuse).currentOffset);
          olimit_2 = (BYTE *)dest;
          iend_2 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_0010ff50:
            pcVar12 = source + ((long)inputSize - (long)iend_2);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_2 + (long)(pcVar12 + (ulong)(pcVar12 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_65c = 0;
            }
            else {
              if (pcVar12 < (char *)0xf) {
                *olimit_2 = (char)pcVar12 * '\x10';
                olimit_2 = olimit_2 + 1;
              }
              else {
                *olimit_2 = 0xf0;
                pBVar9 = olimit_2;
                for (local_760 = pcVar12 + -0xf; olimit_2 = pBVar9 + 1, (char *)0xfe < local_760;
                    local_760 = local_760 + -0xff) {
                  *olimit_2 = 0xff;
                  pBVar9 = olimit_2;
                }
                *olimit_2 = (BYTE)local_760;
                olimit_2 = pBVar9 + 2;
              }
              memcpy(olimit_2,iend_2,(size_t)pcVar12);
              local_65c = ((int)pcVar12 + (int)olimit_2) - local_450;
            }
          }
          else {
            rVar10 = LZ4_read_ARCH(source);
            UVar2 = LZ4_hash5(rVar10,byU32);
            LZ4_putPositionOnHash((BYTE *)source,UVar2,LZ4_stream,byU32,pBVar11);
            base_2 = (BYTE *)(source + 1);
            rVar10 = LZ4_read_ARCH(base_2);
            refDelta_2._4_4_ = LZ4_hash5(rVar10,byU32);
            while( true ) {
              _searchMatchNb_2 = base_2;
              h_11 = 1;
              litLength_2 = streamPtr._4_4_ << 6;
              do {
                base_2 = _searchMatchNb_2;
                pBVar13 = _searchMatchNb_2 + h_11;
                h_11 = litLength_2 >> 6;
                if (source + (long)inputSize + -0xc < pBVar13) goto LAB_0010ff50;
                token_2 = LZ4_getPositionOnHash(refDelta_2._4_4_,LZ4_stream,byU32,pBVar11);
                match_2 = puVar7 + ((ulong)uVar6 - (long)source);
                lowRefLimit_2 = puVar7;
                if (source <= token_2) {
                  match_2 = (BYTE *)0x0;
                  lowRefLimit_2 = (BYTE *)source;
                }
                rVar10 = LZ4_read_ARCH(pBVar13);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_2,refDelta_2._4_4_,LZ4_stream,byU32,pBVar11);
                bVar14 = true;
                if ((source + -(ulong)uVar1 <= token_2) &&
                   (bVar14 = true, _searchMatchNb_2 <= token_2 + 0xffff)) {
                  UVar3 = LZ4_read32(token_2 + (long)match_2);
                  UVar4 = LZ4_read32(_searchMatchNb_2);
                  bVar14 = UVar3 != UVar4;
                }
                litLength_2 = litLength_2 + 1;
                _searchMatchNb_2 = pBVar13;
                refDelta_2._4_4_ = UVar2;
              } while (bVar14);
              while( true ) {
                bVar14 = false;
                if (iend_2 < base_2 && lowRefLimit_2 < token_2 + (long)match_2) {
                  bVar14 = base_2[-1] == token_2[(long)(match_2 + -1)];
                }
                if (!bVar14) break;
                base_2 = base_2 + -1;
                token_2 = token_2 + -1;
              }
              uVar5 = (int)base_2 - (int)iend_2;
              pBVar13 = olimit_2 + 1;
              forwardIp_2 = olimit_2;
              if (dest + maxOutputSize < pBVar13 + (ulong)uVar5 / 0xff + (ulong)uVar5 + 8) break;
              if (uVar5 < 0xf) {
                *olimit_2 = (char)uVar5 * '\x10';
                olimit_2 = pBVar13;
              }
              else {
                *olimit_2 = 0xf0;
                olimit_2 = pBVar13;
                for (limit_2._4_4_ = uVar5 - 0xf; 0xfe < limit_2._4_4_;
                    limit_2._4_4_ = limit_2._4_4_ + -0xff) {
                  *olimit_2 = 0xff;
                  olimit_2 = olimit_2 + 1;
                }
                *olimit_2 = (BYTE)limit_2._4_4_;
                olimit_2 = olimit_2 + 1;
              }
              LZ4_wildCopy(olimit_2,iend_2,olimit_2 + uVar5);
              olimit_2 = olimit_2 + uVar5;
              while( true ) {
                LZ4_writeLE16(olimit_2,(short)base_2 - (short)token_2);
                pBVar13 = olimit_2 + 2;
                if (lowRefLimit_2 == puVar7) {
                  pBStack_748 = base_2 + (long)(puVar7 + ((ulong)uVar6 -
                                                         (long)(match_2 + (long)token_2)));
                  if (pBVar9 < base_2 + (long)(puVar7 + ((ulong)uVar6 -
                                                        (long)(match_2 + (long)token_2)))) {
                    pBStack_748 = pBVar9;
                  }
                  limit_2._0_4_ = LZ4_count(base_2 + 4,match_2 + (long)token_2 + 4,pBStack_748);
                  base_2 = base_2 + ((uint)limit_2 + 4);
                  if (base_2 == pBStack_748) {
                    uVar5 = LZ4_count(base_2,(BYTE *)source,pBVar9);
                    limit_2._0_4_ = uVar5 + (uint)limit_2;
                    base_2 = base_2 + uVar5;
                  }
                }
                else {
                  limit_2._0_4_ = LZ4_count(base_2 + 4,token_2 + 4,pBVar9);
                  base_2 = base_2 + ((uint)limit_2 + 4);
                }
                if (dest + maxOutputSize < olimit_2 + (ulong)((uint)limit_2 >> 8) + 8) {
                  local_65c = 0;
                  goto LAB_001100d5;
                }
                olimit_2 = pBVar13;
                if ((uint)limit_2 < 0xf) {
                  *forwardIp_2 = *forwardIp_2 + (char)(uint)limit_2;
                }
                else {
                  *forwardIp_2 = *forwardIp_2 + '\x0f';
                  limit_2._0_4_ = (uint)limit_2 - 0xf;
                  LZ4_write32(pBVar13,0xffffffff);
                  for (; 0x3fb < (uint)limit_2; limit_2._0_4_ = (uint)limit_2 - 0x3fc) {
                    olimit_2 = olimit_2 + 4;
                    LZ4_write32(olimit_2,0xffffffff);
                  }
                  olimit_2[(ulong)(uint)limit_2 / 0xff] = (BYTE)((ulong)(uint)limit_2 % 0xff);
                  olimit_2 = olimit_2 + (ulong)(uint)limit_2 / 0xff + 1;
                }
                iend_2 = base_2;
                if (source + (long)inputSize + -0xc < base_2) goto LAB_0010ff50;
                rVar10 = LZ4_read_ARCH(base_2 + -2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(base_2 + -2,UVar2,LZ4_stream,byU32,pBVar11);
                rVar10 = LZ4_read_ARCH(base_2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                token_2 = LZ4_getPositionOnHash(UVar2,LZ4_stream,byU32,pBVar11);
                match_2 = puVar7 + ((ulong)uVar6 - (long)source);
                lowRefLimit_2 = puVar7;
                if (source <= token_2) {
                  match_2 = (BYTE *)0x0;
                  lowRefLimit_2 = (BYTE *)source;
                }
                rVar10 = LZ4_read_ARCH(base_2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(base_2,UVar2,LZ4_stream,byU32,pBVar11);
                if ((token_2 < source + -(ulong)uVar1) || (token_2 + 0xffff < base_2)) break;
                UVar2 = LZ4_read32(token_2 + (long)match_2);
                UVar3 = LZ4_read32(base_2);
                if (UVar2 != UVar3) break;
                forwardIp_2 = olimit_2;
                *olimit_2 = '\0';
                olimit_2 = olimit_2 + 1;
              }
              base_2 = base_2 + 1;
              rVar10 = LZ4_read_ARCH(base_2);
              refDelta_2._4_4_ = LZ4_hash5(rVar10,byU32);
            }
            local_65c = 0;
          }
        }
        else {
          local_65c = 0;
        }
LAB_001100d5:
        local_8c0 = local_65c;
      }
      else {
        puVar7 = (LZ4_stream->internal_donotuse).dictionary;
        uVar1 = (LZ4_stream->internal_donotuse).dictSize;
        pBVar9 = (BYTE *)(source + (long)inputSize + -5);
        if ((uint)inputSize < 0x7e000001) {
          pBVar11 = (BYTE *)(source + -(ulong)(LZ4_stream->internal_donotuse).currentOffset);
          olimit_3 = (BYTE *)dest;
          iend_3 = (BYTE *)source;
          if (inputSize < 0xd) {
LAB_00110f4e:
            pcVar12 = source + ((long)inputSize - (long)iend_3);
            if ((BYTE *)(ulong)(uint)maxOutputSize <
                olimit_3 + (long)(pcVar12 + (ulong)(pcVar12 + 0xf0) / 0xff + (1 - (long)dest))) {
              local_764 = 0;
            }
            else {
              if (pcVar12 < (char *)0xf) {
                *olimit_3 = (char)pcVar12 * '\x10';
                olimit_3 = olimit_3 + 1;
              }
              else {
                *olimit_3 = 0xf0;
                pBVar9 = olimit_3;
                for (local_868 = pcVar12 + -0xf; olimit_3 = pBVar9 + 1, (char *)0xfe < local_868;
                    local_868 = local_868 + -0xff) {
                  *olimit_3 = 0xff;
                  pBVar9 = olimit_3;
                }
                *olimit_3 = (BYTE)local_868;
                olimit_3 = pBVar9 + 2;
              }
              memcpy(olimit_3,iend_3,(size_t)pcVar12);
              local_764 = ((int)pcVar12 + (int)olimit_3) - local_450;
            }
          }
          else {
            rVar10 = LZ4_read_ARCH(source);
            UVar2 = LZ4_hash5(rVar10,byU32);
            LZ4_putPositionOnHash((BYTE *)source,UVar2,LZ4_stream,byU32,pBVar11);
            base_3 = (BYTE *)(source + 1);
            rVar10 = LZ4_read_ARCH(base_3);
            refDelta_3._4_4_ = LZ4_hash5(rVar10,byU32);
            while( true ) {
              _searchMatchNb_3 = base_3;
              h_16 = 1;
              litLength_3 = streamPtr._4_4_ << 6;
              do {
                base_3 = _searchMatchNb_3;
                pBVar13 = _searchMatchNb_3 + h_16;
                h_16 = litLength_3 >> 6;
                if (source + (long)inputSize + -0xc < pBVar13) goto LAB_00110f4e;
                token_3 = LZ4_getPositionOnHash(refDelta_3._4_4_,LZ4_stream,byU32,pBVar11);
                match_3 = puVar7 + ((ulong)uVar1 - (long)source);
                lowRefLimit_3 = puVar7;
                if (source <= token_3) {
                  match_3 = (BYTE *)0x0;
                  lowRefLimit_3 = (BYTE *)source;
                }
                rVar10 = LZ4_read_ARCH(pBVar13);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(_searchMatchNb_3,refDelta_3._4_4_,LZ4_stream,byU32,pBVar11);
                bVar14 = true;
                if (_searchMatchNb_3 <= token_3 + 0xffff) {
                  UVar3 = LZ4_read32(token_3 + (long)match_3);
                  UVar4 = LZ4_read32(_searchMatchNb_3);
                  bVar14 = UVar3 != UVar4;
                }
                litLength_3 = litLength_3 + 1;
                _searchMatchNb_3 = pBVar13;
                refDelta_3._4_4_ = UVar2;
              } while (bVar14);
              while( true ) {
                bVar14 = false;
                if (iend_3 < base_3 && lowRefLimit_3 < token_3 + (long)match_3) {
                  bVar14 = base_3[-1] == token_3[(long)(match_3 + -1)];
                }
                if (!bVar14) break;
                base_3 = base_3 + -1;
                token_3 = token_3 + -1;
              }
              uVar6 = (int)base_3 - (int)iend_3;
              pBVar13 = olimit_3 + 1;
              forwardIp_3 = olimit_3;
              if (dest + maxOutputSize < pBVar13 + (ulong)uVar6 / 0xff + (ulong)uVar6 + 8) break;
              if (uVar6 < 0xf) {
                *olimit_3 = (char)uVar6 * '\x10';
                olimit_3 = pBVar13;
              }
              else {
                *olimit_3 = 0xf0;
                olimit_3 = pBVar13;
                for (limit_3._4_4_ = uVar6 - 0xf; 0xfe < limit_3._4_4_;
                    limit_3._4_4_ = limit_3._4_4_ + -0xff) {
                  *olimit_3 = 0xff;
                  olimit_3 = olimit_3 + 1;
                }
                *olimit_3 = (BYTE)limit_3._4_4_;
                olimit_3 = olimit_3 + 1;
              }
              LZ4_wildCopy(olimit_3,iend_3,olimit_3 + uVar6);
              olimit_3 = olimit_3 + uVar6;
              while( true ) {
                LZ4_writeLE16(olimit_3,(short)base_3 - (short)token_3);
                pBVar13 = olimit_3 + 2;
                if (lowRefLimit_3 == puVar7) {
                  pBStack_850 = base_3 + (long)(puVar7 + ((ulong)uVar1 -
                                                         (long)(match_3 + (long)token_3)));
                  if (pBVar9 < base_3 + (long)(puVar7 + ((ulong)uVar1 -
                                                        (long)(match_3 + (long)token_3)))) {
                    pBStack_850 = pBVar9;
                  }
                  limit_3._0_4_ = LZ4_count(base_3 + 4,match_3 + (long)token_3 + 4,pBStack_850);
                  base_3 = base_3 + ((uint)limit_3 + 4);
                  if (base_3 == pBStack_850) {
                    uVar6 = LZ4_count(base_3,(BYTE *)source,pBVar9);
                    limit_3._0_4_ = uVar6 + (uint)limit_3;
                    base_3 = base_3 + uVar6;
                  }
                }
                else {
                  limit_3._0_4_ = LZ4_count(base_3 + 4,token_3 + 4,pBVar9);
                  base_3 = base_3 + ((uint)limit_3 + 4);
                }
                if (dest + maxOutputSize < olimit_3 + (ulong)((uint)limit_3 >> 8) + 8) {
                  local_764 = 0;
                  goto LAB_001110d3;
                }
                olimit_3 = pBVar13;
                if ((uint)limit_3 < 0xf) {
                  *forwardIp_3 = *forwardIp_3 + (char)(uint)limit_3;
                }
                else {
                  *forwardIp_3 = *forwardIp_3 + '\x0f';
                  limit_3._0_4_ = (uint)limit_3 - 0xf;
                  LZ4_write32(pBVar13,0xffffffff);
                  for (; 0x3fb < (uint)limit_3; limit_3._0_4_ = (uint)limit_3 - 0x3fc) {
                    olimit_3 = olimit_3 + 4;
                    LZ4_write32(olimit_3,0xffffffff);
                  }
                  olimit_3[(ulong)(uint)limit_3 / 0xff] = (BYTE)((ulong)(uint)limit_3 % 0xff);
                  olimit_3 = olimit_3 + (ulong)(uint)limit_3 / 0xff + 1;
                }
                iend_3 = base_3;
                if (source + (long)inputSize + -0xc < base_3) goto LAB_00110f4e;
                rVar10 = LZ4_read_ARCH(base_3 + -2);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(base_3 + -2,UVar2,LZ4_stream,byU32,pBVar11);
                rVar10 = LZ4_read_ARCH(base_3);
                UVar2 = LZ4_hash5(rVar10,byU32);
                token_3 = LZ4_getPositionOnHash(UVar2,LZ4_stream,byU32,pBVar11);
                match_3 = puVar7 + ((ulong)uVar1 - (long)source);
                lowRefLimit_3 = puVar7;
                if (source <= token_3) {
                  match_3 = (BYTE *)0x0;
                  lowRefLimit_3 = (BYTE *)source;
                }
                rVar10 = LZ4_read_ARCH(base_3);
                UVar2 = LZ4_hash5(rVar10,byU32);
                LZ4_putPositionOnHash(base_3,UVar2,LZ4_stream,byU32,pBVar11);
                if (token_3 + 0xffff < base_3) break;
                UVar2 = LZ4_read32(token_3 + (long)match_3);
                UVar3 = LZ4_read32(base_3);
                if (UVar2 != UVar3) break;
                forwardIp_3 = olimit_3;
                *olimit_3 = '\0';
                olimit_3 = olimit_3 + 1;
              }
              base_3 = base_3 + 1;
              rVar10 = LZ4_read_ARCH(base_3);
              refDelta_3._4_4_ = LZ4_hash5(rVar10,byU32);
            }
            local_764 = 0;
          }
        }
        else {
          local_764 = 0;
        }
LAB_001110d3:
        local_8c0 = local_764;
      }
      (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
      (LZ4_stream->internal_donotuse).dictSize = inputSize;
      (LZ4_stream->internal_donotuse).currentOffset =
           inputSize + (LZ4_stream->internal_donotuse).currentOffset;
      LZ4_stream_local._4_4_ = local_8c0;
    }
  }
  else {
    LZ4_stream_local._4_4_ = 0;
  }
  return LZ4_stream_local._4_4_;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {   int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(streamPtr, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}